

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Minisat::Solver::reduceDB_Core(Solver *this)

{
  ulong *puVar1;
  uint *puVar2;
  uint *puVar3;
  ulong uVar4;
  lbool *plVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  
  if (0 < this->verbosity) {
    printf("c Core size before reduce: %i\n",(ulong)(uint)(this->learnts_core).sz);
  }
  sort<unsigned_int,reduceDB_c>
            ((this->learnts_core).data,(this->learnts_core).sz,(reduceDB_c)&this->ca);
  uVar11 = (this->learnts_core).sz;
  if ((int)uVar11 < 1) {
    iVar6 = 0;
    lVar13 = 0;
  }
  else {
    uVar10 = uVar11 >> 1;
    lVar14 = 0;
    lVar13 = 0;
    iVar6 = 0;
    do {
      puVar2 = (this->learnts_core).data;
      uVar11 = *(uint *)((long)puVar2 + lVar14);
      puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      uVar4 = *(ulong *)(puVar3 + uVar11);
      if ((~(uint)uVar4 & 3) == 0) {
        puVar1 = (ulong *)(puVar3 + uVar11);
        if (0x40 < ((uint)uVar4 & 0x3fffffe0)) {
          if ((uVar4 & 0xfffffffc00000000) == 0x800000000) {
            plVar5 = (this->assigns).data;
            uVar8 = (uint)(plVar5[(int)puVar1[1] >> 1].value != ((byte)(int)puVar1[1] & 1));
          }
          else {
            plVar5 = (this->assigns).data;
            uVar8 = 0;
          }
          iVar12 = *(int *)((long)puVar1 + (ulong)uVar8 * 4 + 8);
          iVar9 = iVar12 >> 1;
          if ((((plVar5[iVar9].value != ((byte)iVar12 & 1)) ||
               (uVar8 = (this->vardata).data[iVar9].reason, uVar8 == 0xffffffff || uVar8 != uVar11))
              && ((ulong)(*(int *)((long)puVar1 + (uVar4 >> 0x22) * 4 + 0xc) + 100000) <
                  this->conflicts)) && (lVar13 < (int)uVar10)) {
            vec<unsigned_int>::push(&this->learnts_tier2,(uint *)((long)puVar2 + lVar14));
            uVar4 = *puVar1;
            *puVar1 = uVar4 & 0xfffffffffffffffc | 2;
            *(int *)((long)puVar1 + (uVar4 >> 0x22) * 4 + 0xc) = (int)this->conflicts;
            goto LAB_00116799;
          }
        }
        puVar2[iVar6] = uVar11;
        uVar4 = *puVar1;
        if ((uVar4 & 0xfffffffc00000000) == 0x800000000) {
          plVar5 = (this->assigns).data;
          uVar7 = (ulong)(plVar5[(int)puVar1[1] >> 1].value != ((byte)(int)puVar1[1] & 1));
        }
        else {
          plVar5 = (this->assigns).data;
          uVar7 = 0;
        }
        iVar6 = iVar6 + 1;
        iVar12 = *(int *)((long)puVar1 + uVar7 * 4 + 8);
        iVar9 = iVar12 >> 1;
        if (((plVar5[iVar9].value == ((byte)iVar12 & 1)) &&
            (uVar8 = (this->vardata).data[iVar9].reason, uVar8 != 0xffffffff && uVar8 == uVar11)) ||
           ((((uint)uVar4 & 0x3fffffe0) < 0x60 ||
            ((ulong)(*(int *)((long)puVar1 + (uVar4 >> 0x22) * 4 + 0xc) + 50000) < this->conflicts))
           )) {
          uVar10 = uVar10 + 1;
        }
      }
LAB_00116799:
      lVar13 = lVar13 + 1;
      uVar11 = (this->learnts_core).sz;
      lVar14 = lVar14 + 4;
    } while (lVar13 < (int)uVar11);
  }
  dVar15 = (double)(int)uVar11;
  iVar12 = (int)lVar13 - iVar6;
  if (iVar12 != 0 && iVar6 <= (int)lVar13) {
    uVar11 = uVar11 - iVar12;
    (this->learnts_core).sz = uVar11;
  }
  if (0 < this->verbosity) {
    printf("c Core size after reduce: %i, dropped more than 5 percent: %d\n",(ulong)uVar11,
           (ulong)((double)iVar6 < dVar15 * 0.95));
  }
  return (double)iVar6 < dVar15 * 0.95;
}

Assistant:

bool Solver::reduceDB_Core()
{
    if (verbosity > 0) printf("c Core size before reduce: %i\n", learnts_core.size());
    int i, j;
    bool ret = false;
    sort(learnts_core, reduceDB_c(ca));
    int limit = learnts_core.size() / 2;

    for (i = j = 0; i < learnts_core.size(); i++) {
        Clause &c = ca[learnts_core[i]];
        if (c.mark() == CORE) {
            if (c.lbd() > 2 && !locked(c) && (c.touched() + 100000 < conflicts) && i < limit) {
                learnts_tier2.push(learnts_core[i]);
                c.mark(TIER2);
                // c.removable(true);
                // c.activity() = 0;
                c.touched() = conflicts;
                // claBumpActivity(c);
            } else {
                learnts_core[j++] = learnts_core[i];
                if (locked(c) || (c.touched() + 50000 < conflicts) || c.lbd() <= 2) {
                    limit++;
                }
            }
        }
    }
    ret = j < learnts_core.size() * 0.95;
    learnts_core.shrink(i - j);
    if (verbosity > 0)
        printf("c Core size after reduce: %i, dropped more than 5 percent: %d\n", learnts_core.size(), ret);

    return ret;
}